

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

ssize_t __thiscall Process::Arguments::read(Arguments *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  char **ppcVar4;
  int iVar5;
  char *start;
  String *extraout_RAX;
  String *extraout_RAX_00;
  String *pSVar6;
  char *pcVar7;
  String *extraout_RAX_01;
  String *extraout_RAX_02;
  Option *pOVar8;
  char cVar9;
  long lVar10;
  undefined4 in_register_00000034;
  int *piVar11;
  char *str;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  usize uVar15;
  
  piVar11 = (int *)CONCAT44(in_register_00000034,__fd);
  if (*this->arg == '\0') {
    ppcVar4 = this->argv;
    if (this->argvEnd <= ppcVar4) {
      return 0;
    }
    this->argv = ppcVar4 + 1;
    str = *ppcVar4;
    this->arg = str;
    this->inOpt = false;
LAB_001045c1:
    if ((this->skipOpt == false) && (*str == '-')) {
      if (str[1] == '-') {
        pcVar7 = str + 2;
        this->arg = pcVar7;
        pcVar14 = pcVar7;
        cVar2 = str[2];
        if (str[2] != '\0') {
          do {
            cVar9 = cVar2;
            if (cVar9 == '=') goto LAB_00104617;
            pcVar12 = pcVar14 + 1;
            pcVar14 = pcVar14 + 1;
            cVar2 = *pcVar12;
          } while (*pcVar12 != '\0');
          pcVar12 = str + 1;
          do {
            pcVar14 = pcVar12 + 1;
            pcVar1 = pcVar12 + 1;
            pcVar12 = pcVar14;
          } while (*pcVar1 != '\0');
LAB_00104617:
          pOVar8 = this->options;
          if (pOVar8 < this->optionsEnd) {
            lVar10 = (long)pcVar14 - (long)pcVar7;
LAB_0010462a:
            pcVar12 = pOVar8->name;
            if (pcVar12 == (char *)0x0) goto LAB_0010466c;
            pcVar1 = pcVar12 + lVar10;
            pcVar13 = pcVar7;
            if (0 < lVar10) {
              do {
                cVar2 = *pcVar12;
                if ((cVar2 == '\0') || (cVar2 != *pcVar13)) {
                  if (cVar2 != *pcVar13) goto LAB_0010466c;
                  break;
                }
                pcVar12 = pcVar12 + 1;
                pcVar13 = pcVar13 + 1;
              } while (pcVar12 < pcVar1);
            }
            if (*pcVar1 != '\0') goto LAB_0010466c;
            *piVar11 = pOVar8->character;
            pcVar7 = pcVar7 + (ulong)(cVar9 == '=') + lVar10;
            this->arg = pcVar7;
            if ((pOVar8->flags & 1) == 0) goto LAB_001048a8;
            if (cVar9 != '=') {
              if ((pOVar8->flags & 2) != 0) goto LAB_001048a8;
              if (*pcVar7 == '\0') {
                ppcVar4 = this->argv;
                if (this->argvEnd <= ppcVar4) {
                  String::attach((String *)__buf,str,lVar10 + 2);
                  pSVar6 = extraout_RAX_02;
                  goto LAB_00104851;
                }
                this->argv = ppcVar4 + 1;
                pcVar7 = *ppcVar4;
                this->arg = pcVar7;
                this->inOpt = false;
              }
              else {
                pcVar7 = pcVar7 + 1;
                this->arg = pcVar7;
              }
            }
            uVar15 = 0xffffffffffffffff;
            do {
              lVar10 = uVar15 + 1;
              uVar15 = uVar15 + 1;
            } while (pcVar7[lVar10] != '\0');
            goto LAB_0010472d;
          }
LAB_00104675:
          *piVar11 = 0x3f;
          pcVar14 = pcVar14 + ~(ulong)str;
          do {
            pcVar7 = str + 1 + (long)pcVar14;
            pcVar14 = pcVar14 + 1;
          } while (*pcVar7 != '\0');
          String::attach((String *)__buf,str,(usize)pcVar14);
          pSVar6 = (String *)(this->arg + (long)pcVar14 + -2);
          this->arg = (char *)pSVar6;
          goto LAB_001047be;
        }
        this->skipOpt = true;
        if (*pcVar7 == '\0') {
          ppcVar4 = this->argv;
          if (this->argvEnd <= ppcVar4) {
            return 0;
          }
          this->argv = ppcVar4 + 1;
          str = *ppcVar4;
          this->arg = str;
          this->inOpt = false;
        }
        else {
          str = str + 3;
          this->arg = str;
        }
      }
      else {
        pcVar14 = str + 1;
        this->arg = pcVar14;
        if (*pcVar14 == '\0') {
          *piVar11 = 0;
          String::attach((String *)__buf,str,1);
          pSVar6 = extraout_RAX_00;
          goto LAB_001047be;
        }
        this->inOpt = true;
        str = pcVar14;
      }
    }
  }
  else {
    str = this->arg + 1;
    this->arg = str;
    if ((this->inOpt & 1U) == 0) goto LAB_001045c1;
  }
  if (this->inOpt == true) {
    pcVar7 = str + 1;
    this->arg = pcVar7;
    cVar2 = *str;
    *piVar11 = (int)cVar2;
    pOVar8 = this->options;
LAB_001046fa:
    if (pOVar8 < this->optionsEnd) {
      if (pOVar8->character != (int)cVar2) goto code_r0x00104707;
      if ((pOVar8->flags & 3) == 1) {
        if (*pcVar7 == '\0') {
          ppcVar4 = this->argv;
          if (this->argvEnd <= ppcVar4) {
            String::clear((String *)__buf);
            String::append((String *)__buf,'-');
            pSVar6 = String::append((String *)__buf,(char)*piVar11);
LAB_00104851:
            *piVar11 = 0x3a;
            goto LAB_001047be;
          }
          this->argv = ppcVar4 + 1;
          pcVar7 = *ppcVar4;
          this->arg = pcVar7;
          this->inOpt = false;
        }
        uVar15 = 0xffffffffffffffff;
        do {
          lVar10 = uVar15 + 1;
          uVar15 = uVar15 + 1;
        } while (pcVar7[lVar10] != '\0');
        goto LAB_0010472d;
      }
LAB_001048a8:
      String::clear((String *)__buf);
      pSVar6 = extraout_RAX_01;
    }
    else {
      String::clear((String *)__buf);
      uVar15 = *(usize *)(*__buf + 8);
      String::detach((String *)__buf,uVar15,uVar15 + 1);
      *(undefined1 *)(**__buf + (*__buf)[1]) = 0x2d;
      plVar3 = *__buf;
      plVar3[1] = uVar15 + 1;
      *(undefined1 *)(*plVar3 + 1 + uVar15) = 0;
      iVar5 = *piVar11;
      uVar15 = *(usize *)(*__buf + 8);
      String::detach((String *)__buf,uVar15,uVar15 + 1);
      *(char *)(**__buf + (*__buf)[1]) = (char)iVar5;
      pSVar6 = *__buf;
      (pSVar6->_data).str = (char *)(uVar15 + 1);
      *(undefined1 *)((long)&pSVar6->data->str + uVar15 + 1) = 0;
      *piVar11 = 0x3f;
    }
  }
  else {
    *piVar11 = 0;
    uVar15 = 0xffffffffffffffff;
    do {
      lVar10 = uVar15 + 1;
      uVar15 = uVar15 + 1;
      pcVar7 = str;
    } while (str[lVar10] != '\0');
LAB_0010472d:
    String::attach((String *)__buf,pcVar7,uVar15);
    this->arg = this->arg + uVar15;
    pSVar6 = extraout_RAX;
  }
LAB_001047be:
  return CONCAT71((int7)((ulong)pSVar6 >> 8),1);
LAB_0010466c:
  pOVar8 = pOVar8 + 1;
  if (this->optionsEnd <= pOVar8) goto LAB_00104675;
  goto LAB_0010462a;
code_r0x00104707:
  pOVar8 = pOVar8 + 1;
  goto LAB_001046fa;
}

Assistant:

bool Process::Arguments::read(int& character, String& argument)
{
  if(!nextChar())
    return false;

  if(!inOpt && !skipOpt)
  {
    if(*arg == '-')
    {
      if(arg[1] == '-')
      { // handel '--' arg
        arg += 2;
        if(!*arg)
        {
          skipOpt = true;
          if(!nextChar())
            return false;
        }
        else
        {
          const char* end = String::find(arg, '=');
          usize argLen = end ? end - arg : String::length(arg);
          for(const Option* opt = options; opt < optionsEnd; ++opt)
            if(opt->name && String::compare(opt->name, arg, argLen) == 0 && !opt->name[argLen])
            {
              const char* argName = arg;
              character = opt->character;
              arg += end ? argLen + 1 : argLen;
              if(opt->flags & Process::argumentFlag)
              {
                if(end || (!(opt->flags & Process::optionalFlag) && nextChar()))
                {
                  usize len = String::length(arg);
                  argument.attach(arg, len);
                  arg += len;
                  return true;
                }
                if(!(opt->flags & Process::optionalFlag))
                {
                  // missing argument
                  argument.attach(argName - 2, argLen + 2);
                  character = ':';
                  return true;
                }
              }
              argument.clear();
              return true;
            }

          // unknown option
          character = '?';
          argLen += String::length(arg + argLen);
          argument.attach(arg - 2, argLen + 2);
          arg += argLen;
          return true;
        }
      }
      else
      {
        if(!*(++arg))
        {
          character = 0;
          argument.attach(arg - 1, 1); // "-"
          return true;
        }
        inOpt = true;
      }
    }
  }

  // find option *str
  if(inOpt)
  {
    character = *(arg++);
    for(const Option* opt = options; opt < optionsEnd; ++opt)
      if(opt->character == character)
      {
        if(opt->flags & Process::argumentFlag && !(opt->flags & Process::optionalFlag))
        {
          if(!*arg)
          {
            if(!nextChar())
            { // missing argument
              argument.clear();
              argument.append('-');
              argument.append((char)character);
              character = ':';
              return true;
            }
          }
          usize len = String::length(arg);
          argument.attach(arg, len);
          arg += len;
          return true;
        }
        argument.clear();
        return true;
      }

    // unknown option
    argument.clear();
    argument.append('-');
    argument.append((char)character);
    character = '?';
    return true;
  }

  // non option argument
  character = '\0';
  usize len = String::length(arg);
  argument.attach(arg, len);
  arg += len;
  return true;
}